

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_outs(DisasContext *s,MemOp ot)

{
  MemOp ot_00;
  TCGContext *tcg_ctx;
  TCGv_i64 addr;
  TCGv_i64 val;
  TCGContext *pTVar1;
  TCGArg a2;
  uintptr_t o;
  TCGv_i32 pTVar2;
  TCGTemp *ts;
  
  tcg_ctx = s->uc->tcg_ctx;
  if ((((s->base).tb)->cflags & 0x20000) != 0) {
    pTVar2 = tcg_const_i32_x86_64(tcg_ctx,1);
    tcg_gen_op3_x86_64(tcg_ctx,INDEX_op_st_i32,(TCGArg)(pTVar2 + (long)tcg_ctx),
                       (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),0xfffffffffffff74c);
    tcg_temp_free_internal_x86_64(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
  }
  gen_lea_v_seg(s,s->aflag,s->uc->tcg_ctx->cpu_regs[6],3,s->override);
  addr = s->A0;
  val = s->T0;
  pTVar1 = s->uc->tcg_ctx;
  if (s->uc->hook[10].head != (list_item *)0x0) {
    a2 = s->prev_pc;
    ts = tcg_temp_new_internal_x86_64(pTVar1,TCG_TYPE_I64,false);
    tcg_gen_op2_x86_64(pTVar1,INDEX_op_movi_i64,(TCGArg)ts,a2);
    tcg_gen_op3_x86_64(pTVar1,INDEX_op_st_i64,(TCGArg)ts,(TCGArg)(pTVar1->cpu_env + (long)pTVar1),
                       0x80);
    tcg_temp_free_internal_x86_64(pTVar1,ts);
  }
  tcg_gen_qemu_ld_i64_x86_64(pTVar1,val,addr,(long)s->mem_index,ot);
  tcg_gen_extrl_i64_i32_x86_64(tcg_ctx,s->tmp2_i32,tcg_ctx->cpu_regs[2]);
  tcg_gen_andi_i32_x86_64(tcg_ctx,s->tmp2_i32,s->tmp2_i32,0xffff);
  tcg_gen_extrl_i64_i32_x86_64(tcg_ctx,s->tmp3_i32,s->T0);
  gen_helper_out_func(tcg_ctx,ot,s->tmp2_i32,s->tmp3_i32);
  pTVar1 = s->uc->tcg_ctx;
  tcg_gen_op3_x86_64(pTVar1,INDEX_op_ld32s_i64,(TCGArg)(s->T0 + (long)pTVar1),
                     (TCGArg)(pTVar1->cpu_env + (long)pTVar1),0xac);
  tcg_gen_shli_i64_x86_64(pTVar1,s->T0,s->T0,(ulong)ot);
  ot_00 = s->aflag;
  pTVar1 = s->uc->tcg_ctx;
  tcg_gen_op3_x86_64(pTVar1,INDEX_op_add_i64,(TCGArg)(s->tmp0 + (long)pTVar1),
                     (TCGArg)(pTVar1->cpu_regs[6] + (long)pTVar1),(TCGArg)(s->T0 + (long)pTVar1));
  gen_op_mov_reg_v(s,ot_00,6,s->tmp0);
  gen_bpt_io(s,s->tmp2_i32,ot);
  if ((((s->base).tb)->cflags & 0x20000) == 0) {
    return;
  }
  pTVar2 = tcg_const_i32_x86_64(tcg_ctx,0);
  tcg_gen_op3_x86_64(tcg_ctx,INDEX_op_st_i32,(TCGArg)(pTVar2 + (long)tcg_ctx),
                     (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),0xfffffffffffff74c);
  tcg_temp_free_internal_x86_64(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
  return;
}

Assistant:

static inline void gen_outs(DisasContext *s, MemOp ot)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;

    if (tb_cflags(s->base.tb) & CF_USE_ICOUNT) {
        gen_io_start(tcg_ctx);
    }
    gen_string_movl_A0_ESI(s);
    gen_op_ld_v(s, ot, s->T0, s->A0);

    tcg_gen_trunc_tl_i32(tcg_ctx, s->tmp2_i32, tcg_ctx->cpu_regs[R_EDX]);
    tcg_gen_andi_i32(tcg_ctx, s->tmp2_i32, s->tmp2_i32, 0xffff);
    tcg_gen_trunc_tl_i32(tcg_ctx, s->tmp3_i32, s->T0);
    gen_helper_out_func(tcg_ctx, ot, s->tmp2_i32, s->tmp3_i32);
    gen_op_movl_T0_Dshift(s, ot);
    gen_op_add_reg_T0(s, s->aflag, R_ESI);
    gen_bpt_io(s, s->tmp2_i32, ot);
    if (tb_cflags(s->base.tb) & CF_USE_ICOUNT) {
        gen_io_end(tcg_ctx);
    }
}